

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesPsuGetState(zes_psu_handle_t hPsu,zes_psu_state_t *pState)

{
  zes_pfnPsuGetState_t pfnGetState;
  dditable_t *dditable;
  ze_result_t result;
  zes_psu_state_t *pState_local;
  zes_psu_handle_t hPsu_local;
  
  if (*(code **)(*(long *)(hPsu + 8) + 0xc40) == (code *)0x0) {
    hPsu_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPsu_local._4_4_ = (**(code **)(*(long *)(hPsu + 8) + 0xc40))(*(undefined8 *)hPsu,pState);
  }
  return hPsu_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPsuGetState(
        zes_psu_handle_t hPsu,                          ///< [in] Handle for the component.
        zes_psu_state_t* pState                         ///< [in,out] Will contain the current state of the power supply.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_psu_object_t*>( hPsu )->dditable;
        auto pfnGetState = dditable->zes.Psu.pfnGetState;
        if( nullptr == pfnGetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPsu = reinterpret_cast<zes_psu_object_t*>( hPsu )->handle;

        // forward to device-driver
        result = pfnGetState( hPsu, pState );

        return result;
    }